

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O3

acmod_id_t acmod_set_add_ci(acmod_set_t *acmod_set,char *name,char **attrib)

{
  uint uVar1;
  ci_acmod_t *pcVar2;
  char *pcVar3;
  char **ppcVar4;
  long ln;
  
  if (acmod_set->n_multi == 0) {
    if (acmod_set->n_ci != acmod_set->max_n_ci) {
      uVar1 = acmod_set->next_id;
      acmod_set->next_id = uVar1 + 1;
      acmod_set->n_ci = acmod_set->n_ci + 1;
      pcVar3 = strdup(name);
      acmod_set->ci[uVar1].name = pcVar3;
      ppcVar4 = new_attrib(attrib);
      pcVar2 = acmod_set->ci;
      pcVar2[uVar1].attrib = ppcVar4;
      pcVar2[uVar1].id = (ci_acmod_id_t)uVar1;
      return uVar1;
    }
    pcVar3 = 
    "Current acmod_set implementation requires the \'n_ci_hint\' to beexactly the number to be added.\n"
    ;
    ln = 0x104;
  }
  else {
    pcVar3 = 
    "Current acmod_set implementation requires all CI phonesto be defined before defining multi phones\n"
    ;
    ln = 0xff;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
          ,ln,pcVar3);
  exit(1);
}

Assistant:

acmod_id_t
acmod_set_add_ci(acmod_set_t *acmod_set,
		 const char *name,
		 const char **attrib)
{
    uint32 id;

    if (acmod_set->n_multi > 0) {
	E_FATAL("Current acmod_set implementation requires all CI phones"
		"to be defined before defining multi phones\n");
    }

    if (acmod_set->n_ci == acmod_set->max_n_ci) {
	E_FATAL("Current acmod_set implementation requires the 'n_ci_hint' to be"
		"exactly the number to be added.\n");
    }

    id = acmod_set->next_id;

    acmod_set->next_id++;
    acmod_set->n_ci++;

    /* copy the name and attribute lists so that the caller
     * does not have restrictions on overwriting the value
     * of the passed arguments */

    acmod_set->ci[id].name   = strdup(name);
    acmod_set->ci[id].attrib = new_attrib(attrib);

    /* the following allows ci_acmod_t structures to be
       passed w/o reference to the acmod_set structure itself */
    acmod_set->ci[id].id = id;

    return id;
}